

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

Matrix * Matrix::identity(Matrix *__return_storage_ptr__,int dimensions)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 uVar4;
  
  Matrix(__return_storage_ptr__,dimensions,dimensions);
  if (0 < dimensions) {
    uVar2 = 0;
    do {
      pvVar1 = (__return_storage_ptr__->m).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = 0;
      do {
        if ((long)__return_storage_ptr__->rows <= (long)uVar2) {
          __assert_fail("i >= 0 && i < rows",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/geometry.cpp"
                        ,0x26,"std::vector<float> &Matrix::operator[](const int)");
        }
        uVar4 = 0x3f800000;
        if (uVar2 != uVar3) {
          uVar4 = 0;
        }
        *(undefined4 *)
         (*(long *)&pvVar1[uVar2].super__Vector_base<float,_std::allocator<float>_>._M_impl +
         uVar3 * 4) = uVar4;
        uVar3 = uVar3 + 1;
      } while ((uint)dimensions != uVar3);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)dimensions);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::identity(int dimensions) {
    Matrix E(dimensions, dimensions);
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            E[i][j] = (i == j ? 1.f : 0.f);
        }
    }
    return E;
}